

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdLut.c
# Opt level: O1

int Sbd_ProblemAddClauses(sat_solver *pSat,int nVars,int nStrs,int *pVars,Sbd_Str_t *pStr0)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int pLits [6];
  long local_70;
  uint local_68 [8];
  uint local_48;
  uint local_44;
  sat_solver *local_40;
  Sbd_Str_t *local_38;
  
  if (0 < nStrs) {
    local_38 = pStr0 + nStrs;
    uVar8 = (ulong)(uint)(nStrs + nVars);
    lVar7 = (long)nVars;
    local_40 = pSat;
    do {
      iVar6 = pStr0->nVarIns;
      if (pStr0->fLut == 0) {
        if (10 < iVar6) {
          __assert_fail("pStr->nVarIns <= SBD_DIV_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdLut.c"
                        ,0x54,
                        "int Sbd_ProblemAddClauses(sat_solver *, int, int, int *, Sbd_Str_t *)");
        }
        if (0 < pStr0->nVarIns) {
          uVar8 = (ulong)(int)uVar8;
          local_70 = 0;
          do {
            iVar6 = 0;
            do {
              if (pVars[uVar8] < 0) {
LAB_0053e753:
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12e,"int Abc_Var2Lit(int, int)");
              }
              local_68[0] = pVars[uVar8] * 2 + 1;
              if (pVars[lVar7] < 0) goto LAB_0053e753;
              local_68[1] = iVar6 + pVars[lVar7] * 2;
              if (pVars[pStr0->VarIns[local_70]] < 0) goto LAB_0053e753;
              local_68[2] = iVar6 + pVars[pStr0->VarIns[local_70]] * 2 ^ 1;
              iVar2 = sat_solver_addclause(local_40,(lit *)local_68,(lit *)(local_68 + 3));
              if (iVar2 == 0) {
                return 0;
              }
              iVar6 = iVar6 + 1;
            } while (iVar6 == 1);
            local_70 = local_70 + 1;
            uVar8 = uVar8 + 1;
          } while (local_70 < pStr0->nVarIns);
        }
      }
      else {
        uVar1 = 1 << ((byte)iVar6 & 0x1f);
        if (6 < iVar6) {
          __assert_fail("pStr->nVarIns <= 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdLut.c"
                        ,0x43,
                        "int Sbd_ProblemAddClauses(sat_solver *, int, int, int *, Sbd_Str_t *)");
        }
        uVar8 = (ulong)(int)uVar8;
        local_48 = 1;
        if (1 < (int)uVar1) {
          local_48 = uVar1;
        }
        uVar5 = 0;
        bVar3 = true;
        local_44 = uVar1;
        do {
          iVar6 = pStr0->nVarIns;
          if (0 < (long)iVar6) {
            lVar4 = 0;
            do {
              if (pVars[pStr0->VarIns[lVar4]] < 0) goto LAB_0053e753;
              local_68[lVar4] =
                   (uint)((uVar5 >> ((uint)lVar4 & 0x1f) & 1) != 0) +
                   pVars[pStr0->VarIns[lVar4]] * 2;
              lVar4 = lVar4 + 1;
            } while (iVar6 != lVar4);
          }
          iVar6 = 0;
          do {
            if (pVars[uVar8] < 0) goto LAB_0053e753;
            lVar4 = (long)pStr0->nVarIns;
            local_68[lVar4] = iVar6 + pVars[uVar8] * 2;
            if (pVars[lVar7] < 0) goto LAB_0053e753;
            local_68[lVar4 + 1] = iVar6 + pVars[lVar7] * 2 ^ 1;
            iVar2 = sat_solver_addclause(local_40,(lit *)local_68,(lit *)(local_68 + lVar4 + 2));
            if (iVar2 == 0) {
              if (bVar3) {
                return 0;
              }
              goto LAB_0053e685;
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 == 1);
          uVar5 = uVar5 + 1;
          uVar8 = uVar8 + 1;
          bVar3 = (int)uVar5 < (int)local_44;
        } while (uVar5 != local_48);
      }
LAB_0053e685:
      pStr0 = pStr0 + 1;
      lVar7 = lVar7 + 1;
    } while (pStr0 < local_38);
  }
  return 1;
}

Assistant:

int Sbd_ProblemAddClauses( sat_solver * pSat, int nVars, int nStrs, int * pVars, Sbd_Str_t * pStr0 )
{   
    // variable order:  inputs, structure outputs, parameters
    Sbd_Str_t * pStr;
    int VarOut = nVars;
    int VarPar = nVars + nStrs;
    int m, k, n, status, pLits[SBD_SIZE_MAX+2];
//printf( "Start par = %d.  ", VarPar );
    for ( pStr = pStr0; pStr < pStr0 + nStrs; pStr++, VarOut++ )
    {
        if ( pStr->fLut )
        {
            int nMints = 1 << pStr->nVarIns;
            assert( pStr->nVarIns <= 6 );
            for ( m = 0; m < nMints; m++, VarPar++ )
            {
                for ( k = 0; k < pStr->nVarIns; k++ )
                    pLits[k] = Abc_Var2Lit( pVars[pStr->VarIns[k]], (m >> k) & 1 ); 
                for ( n = 0; n < 2; n++ )
                {
                    pLits[pStr->nVarIns]   = Abc_Var2Lit( pVars[VarPar], n );
                    pLits[pStr->nVarIns+1] = Abc_Var2Lit( pVars[VarOut], !n );
                    status = sat_solver_addclause( pSat, pLits, pLits + pStr->nVarIns + 2 );
                    if ( !status )
                        return 0;
                }
            }
        }
        else
        {
            assert( pStr->nVarIns <= SBD_DIV_MAX );
            for ( k = 0; k < pStr->nVarIns; k++, VarPar++ )
            {
                for ( n = 0; n < 2; n++ )
                {
                    pLits[0] = Abc_Var2Lit( pVars[VarPar], 1 );
                    pLits[1] = Abc_Var2Lit( pVars[VarOut], n );
                    pLits[2] = Abc_Var2Lit( pVars[pStr->VarIns[k]], !n );
                    status = sat_solver_addclause( pSat, pLits, pLits + 3 );
                    if ( !status )
                        return 0;
                }
            }
        }
    }
    return 1;
}